

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManComputeTruthPtr(If_DsdMan_t *p,int iDsd,uchar *pPermLits,word *pRes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int __c;
  ulong uVar4;
  uint uVar5;
  int nSupp;
  uint local_1c;
  
  local_1c = 0;
  if (iDsd < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar2 = (uint)iDsd >> 1;
  if ((p->vObjs).nSize <= (int)uVar2) goto LAB_00423ba3;
  if (iDsd == 1) {
    lVar3 = (long)p->nWords;
    if (0 < lVar3) {
      __c = 0xff;
LAB_00423aec:
      memset(pRes,__c,lVar3 << 3);
    }
  }
  else if (iDsd == 0) {
    lVar3 = (long)p->nWords;
    if (0 < lVar3) {
      __c = 0;
      goto LAB_00423aec;
    }
  }
  else if ((*(uint *)((long)(p->vObjs).pArray[uVar2] + 4) & 7) == 2) {
    if (pPermLits == (uchar *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)*pPermLits;
    }
    local_1c = 1;
    lVar3 = *(long *)((long)p->pTtElems + (ulong)(uVar5 & 0xfffffffe) * 4);
    uVar1 = p->nWords;
    if (((iDsd ^ uVar5) & 1) == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          pRes[uVar4] = *(word *)(lVar3 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        pRes[uVar4] = ~*(ulong *)(lVar3 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    If_DsdManComputeTruth_rec(p,iDsd,pRes,pPermLits,(int *)&local_1c);
  }
  if ((int)uVar2 < (p->vObjs).nSize) {
    if (local_1c != (*(uint *)((long)(p->vObjs).pArray[uVar2] + 4) >> 3 & 0x1f)) {
      __assert_fail("nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x591,
                    "void If_DsdManComputeTruthPtr(If_DsdMan_t *, int, unsigned char *, word *)");
    }
    return;
  }
LAB_00423ba3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void If_DsdManComputeTruthPtr( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits, word * pRes )
{
    int nSupp = 0;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( iDsd == 0 )
        Abc_TtConst0( pRes, p->nWords );
    else if ( iDsd == 1 )
        Abc_TtConst1( pRes, p->nWords );
    else if ( pObj->Type == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[nSupp] : Abc_Var2Lit(nSupp, 0);
        nSupp++;
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, Abc_LitIsCompl(iDsd) ^ Abc_LitIsCompl(iPermLit) );
    }
    else
        If_DsdManComputeTruth_rec( p, iDsd, pRes, pPermLits, &nSupp );
    assert( nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd) );
}